

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::anon_unknown_0::CommandLineInterfaceTest_PrintFreeFieldNumbers_Test::
TestBody(CommandLineInterfaceTest_PrintFreeFieldNumbers_Test *this)

{
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view expected_text;
  string_view contents;
  string_view contents_00;
  string_view contents_01;
  string_view contents_02;
  string local_38;
  
  name._M_str = "foo.proto";
  name._M_len = 9;
  contents._M_str =
       "syntax = \"proto2\";\npackage foo;\nmessage Foo {\n  optional int32 a = 2;\n  optional string b = 4;\n  optional string c = 5;\n  optional int64 d = 8;\n  optional double e = 10;\n}\n"
  ;
  contents._M_len = 0xac;
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,name,contents);
  name_00._M_str = "bar.proto";
  name_00._M_len = 9;
  contents_00._M_str =
       "syntax = \"proto2\";\nmessage Bar {\n  optional int32 a = 2;\n  extensions 4 to 5;\n  optional int64 d = 8;\n  extensions 10;\n}\n"
  ;
  contents_00._M_len = 0x79;
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,name_00,contents_00)
  ;
  name_01._M_str = "baz.proto";
  name_01._M_len = 9;
  contents_01._M_str =
       "syntax = \"proto2\";\nmessage Baz {\n  optional int32 a = 2;\n  optional int64 d = 8;\n  extensions 15 to max;\n  extensions 13;\n  extensions 10 to 12;\n  extensions 5;\n  extensions 4;\n}\n"
  ;
  contents_01._M_len = 0xb3;
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,name_01,contents_01)
  ;
  name_02._M_str = "quz.proto";
  name_02._M_len = 9;
  contents_02._M_str =
       "syntax = \"proto2\";\nmessage Quz {\n  message Foo {}\n  optional int32 a = 2;\n  optional group C = 4 {\n    optional int32 d = 5;\n  }\n  extensions 8 to 10;\n  optional group E = 11 {\n    optional int32 f = 9;\n    optional group G = 15 {\n      message Foo {}\n    }\n  }\n}\n"
  ;
  contents_02._M_len = 0x108;
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,name_02,contents_02)
  ;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,
             "protocol_compiler --print_free_field_numbers --proto_path=$tmpdir foo.proto bar.proto baz.proto quz.proto"
             ,"");
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  CommandLineInterfaceTester::ExpectNoErrors((CommandLineInterfaceTester *)this);
  expected_text._M_str =
       "foo.Foo                             free: 1 3 6-7 9 11-INF\nBar                                 free: 1 3 6-7 9 11-INF\nBaz                                 free: 1 3 6-7 9 14\nQuz.Foo                             free: 1-INF\nQuz.C                               free: 1-4 6-INF\nQuz.E.G.Foo                         free: 1-INF\nQuz.E.G                             free: 1-INF\nQuz.E                               free: 1-8 10-14 16-INF\nQuz                                 free: 1 3 5-7 12-INF\n"
  ;
  expected_text._M_len = 0x1e5;
  CommandLineInterfaceTester::ExpectCapturedStdout((CommandLineInterfaceTester *)this,expected_text)
  ;
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, PrintFreeFieldNumbers) {
  CreateTempFile("foo.proto",
                 "syntax = \"proto2\";\n"
                 "package foo;\n"
                 "message Foo {\n"
                 "  optional int32 a = 2;\n"
                 "  optional string b = 4;\n"
                 "  optional string c = 5;\n"
                 "  optional int64 d = 8;\n"
                 "  optional double e = 10;\n"
                 "}\n");
  CreateTempFile("bar.proto",
                 "syntax = \"proto2\";\n"
                 "message Bar {\n"
                 "  optional int32 a = 2;\n"
                 "  extensions 4 to 5;\n"
                 "  optional int64 d = 8;\n"
                 "  extensions 10;\n"
                 "}\n");
  CreateTempFile("baz.proto",
                 "syntax = \"proto2\";\n"
                 "message Baz {\n"
                 "  optional int32 a = 2;\n"
                 "  optional int64 d = 8;\n"
                 "  extensions 15 to max;\n"  // unordered.
                 "  extensions 13;\n"
                 "  extensions 10 to 12;\n"
                 "  extensions 5;\n"
                 "  extensions 4;\n"
                 "}\n");
  CreateTempFile(
      "quz.proto",
      "syntax = \"proto2\";\n"
      "message Quz {\n"
      "  message Foo {}\n"  // nested message
      "  optional int32 a = 2;\n"
      "  optional group C = 4 {\n"
      "    optional int32 d = 5;\n"
      "  }\n"
      "  extensions 8 to 10;\n"
      "  optional group E = 11 {\n"
      "    optional int32 f = 9;\n"    // explicitly reuse extension range 8-10
      "    optional group G = 15 {\n"  // nested group
      "      message Foo {}\n"         // nested message inside nested group
      "    }\n"
      "  }\n"
      "}\n");

  Run("protocol_compiler --print_free_field_numbers --proto_path=$tmpdir "
      "foo.proto bar.proto baz.proto quz.proto");

  ExpectNoErrors();

  // TODO: Cygwin doesn't work well if we try to capture stderr and
  // stdout at the same time. Need to figure out why and add this test back
  // for Cygwin.
#if !defined(__CYGWIN__)
  ExpectCapturedStdout(
      "foo.Foo                             free: 1 3 6-7 9 11-INF\n"
      "Bar                                 free: 1 3 6-7 9 11-INF\n"
      "Baz                                 free: 1 3 6-7 9 14\n"
      "Quz.Foo                             free: 1-INF\n"
      "Quz.C                               free: 1-4 6-INF\n"
      "Quz.E.G.Foo                         free: 1-INF\n"
      "Quz.E.G                             free: 1-INF\n"
      "Quz.E                               free: 1-8 10-14 16-INF\n"
      "Quz                                 free: 1 3 5-7 12-INF\n");
#endif
}